

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpio.c
# Opt level: O2

int i2cReadWordData(uint handle,uint reg)

{
  int iVar1;
  char *pcVar2;
  FILE *pFVar3;
  ulong uVar4;
  my_smbus_data data;
  
  pFVar3 = _stderr;
  uVar4 = (ulong)handle;
  if ((3 < gpioCfg.dbgLevel) && ((gpioCfg.internals >> 10 & 1) == 0)) {
    myTimeStamp();
    fprintf(pFVar3,"%s %s: handle=%d reg=%d\n",myTimeStamp::buf,"i2cReadWordData",uVar4,(ulong)reg);
  }
  pFVar3 = _stderr;
  if (libInitialised == '\0') {
    iVar1 = -0x1f;
    if ((gpioCfg.internals >> 10 & 1) != 0) {
      return -0x1f;
    }
    myTimeStamp();
    pcVar2 = "%s %s: pigpio uninitialised, call gpioInitialise()\n";
LAB_00108ea5:
    fprintf(pFVar3,pcVar2,myTimeStamp::buf,"i2cReadWordData");
  }
  else {
    if ((handle < 0x40) && (i2cInfo[uVar4].state == 2)) {
      if ((i2cInfo[uVar4].funcs & 0x200000) == 0) {
        iVar1 = -0x6b;
        if ((gpioCfg.internals >> 10 & 1) != 0) {
          return -0x6b;
        }
        myTimeStamp();
        pcVar2 = "%s %s: SMBUS command not supported by driver\n";
        goto LAB_00108ea5;
      }
      if (reg < 0x100) {
        handle = my_smbus_access((int)i2cInfo[uVar4].fd,'\x01',(uint8_t)reg,3,&data);
        pFVar3 = _stderr;
        if (-1 < (int)handle) {
          return (uint)data.word;
        }
        iVar1 = -0x53;
        if (gpioCfg.dbgLevel < 4) {
          return -0x53;
        }
        if ((gpioCfg.internals >> 10 & 1) != 0) {
          return -0x53;
        }
        myTimeStamp();
        pcVar2 = "%s %s: error=%d (%m)\n";
        goto LAB_00108fa0;
      }
      iVar1 = -0x51;
      if ((gpioCfg.internals >> 10 & 1) != 0) {
        return -0x51;
      }
      myTimeStamp();
      pcVar2 = "%s %s: bad reg (%d)\n";
      uVar4 = (ulong)reg;
    }
    else {
      iVar1 = -0x19;
      if ((gpioCfg.internals >> 10 & 1) != 0) {
        return -0x19;
      }
      myTimeStamp();
      pcVar2 = "%s %s: bad handle (%d)\n";
LAB_00108fa0:
      uVar4 = (ulong)handle;
    }
    fprintf(pFVar3,pcVar2,myTimeStamp::buf,"i2cReadWordData",uVar4);
  }
  return iVar1;
}

Assistant:

int i2cReadWordData(unsigned handle, unsigned reg)
{
   union my_smbus_data data;
   int status;

   DBG(DBG_USER, "handle=%d reg=%d", handle, reg);

   CHECK_INITED;

   if (handle >= PI_I2C_SLOTS)
      SOFT_ERROR(PI_BAD_HANDLE, "bad handle (%d)", handle);

   if (i2cInfo[handle].state != PI_I2C_OPENED)
      SOFT_ERROR(PI_BAD_HANDLE, "bad handle (%d)", handle);

   if ((i2cInfo[handle].funcs & PI_I2C_FUNC_SMBUS_READ_WORD_DATA) == 0)
      SOFT_ERROR(PI_BAD_SMBUS_CMD, "SMBUS command not supported by driver");

   if (reg > 0xFF)
      SOFT_ERROR(PI_BAD_PARAM, "bad reg (%d)", reg);

   status = (my_smbus_access(
      i2cInfo[handle].fd,
      PI_I2C_SMBUS_READ,
      reg,
      PI_I2C_SMBUS_WORD_DATA,
      &data));

   if (status < 0)
   {
      DBG(DBG_USER, "error=%d (%m)", status);
      return PI_I2C_READ_FAILED;
   }

   return 0xFFFF & data.word;
}